

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O2

Bdd __thiscall sylvan::Bdd::operator^(Bdd *this,Bdd *other)

{
  BDD BVar1;
  BDDVAR in_ECX;
  BDD *in_RDX;
  
  BVar1 = sylvan_xor_RUN((sylvan *)other->bdd,*in_RDX,(BDD)in_RDX,in_ECX);
  this->bdd = BVar1;
  mtbdd_protect(&this->bdd);
  return (Bdd)(BDD)this;
}

Assistant:

Bdd
Bdd::operator^(const Bdd& other) const
{
    return Bdd(sylvan_xor(bdd, other.bdd));
}